

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_listener_unregister_mips(MemoryListener *listener)

{
  MemoryListener *listener_local;
  
  if (listener->address_space != (AddressSpace *)0x0) {
    listener_del_address_space(listener,listener->address_space);
    if ((listener->link).tqe_next == (MemoryListener *)0x0) {
      (listener->address_space->uc->memory_listeners).tqh_circ.tql_prev =
           (listener->link).tqe_circ.tql_prev;
    }
    else {
      (((listener->link).tqe_next)->link).tqe_circ.tql_prev = (listener->link).tqe_circ.tql_prev;
    }
    ((listener->link).tqe_circ.tql_prev)->tql_next = (listener->link).tqe_next;
    (listener->link).tqe_circ.tql_prev = (QTailQLink *)0x0;
    (listener->link).tqe_next = (MemoryListener *)0x0;
    (listener->link).tqe_next = (MemoryListener *)0x0;
    if ((listener->link_as).tqe_next == (MemoryListener *)0x0) {
      (listener->address_space->listeners).tqh_circ.tql_prev = (listener->link_as).tqe_circ.tql_prev
      ;
    }
    else {
      (((listener->link_as).tqe_next)->link_as).tqe_circ.tql_prev =
           (listener->link_as).tqe_circ.tql_prev;
    }
    ((listener->link_as).tqe_circ.tql_prev)->tql_next = (listener->link_as).tqe_next;
    (listener->link_as).tqe_circ.tql_prev = (QTailQLink *)0x0;
    (listener->link_as).tqe_next = (MemoryListener *)0x0;
    (listener->link_as).tqe_next = (MemoryListener *)0x0;
    listener->address_space = (AddressSpace *)0x0;
  }
  return;
}

Assistant:

void memory_listener_unregister(MemoryListener *listener)
{
    if (!listener->address_space) {
        return;
    }

    listener_del_address_space(listener, listener->address_space);
    QTAILQ_REMOVE(&listener->address_space->uc->memory_listeners, listener, link);
    QTAILQ_REMOVE(&listener->address_space->listeners, listener, link_as);
    listener->address_space = NULL;
}